

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O1

void __thiscall Fl_Type::add(Fl_Type *this,Fl_Type *p)

{
  Fl_Type *pFVar1;
  Fl_Type *pFVar2;
  int iVar3;
  Fl_Type *pFVar4;
  
  if ((p != (Fl_Type *)0x0) && (this->parent == p)) {
    return;
  }
  undo_checkpoint();
  this->parent = p;
  pFVar2 = this;
  do {
    pFVar1 = pFVar2;
    pFVar2 = pFVar1->next;
  } while (pFVar1->next != (Fl_Type *)0x0);
  pFVar2 = p;
  if (p == (Fl_Type *)0x0) {
    pFVar2 = (Fl_Type *)0x0;
    iVar3 = 0;
  }
  else {
    do {
      pFVar2 = pFVar2->next;
      if (pFVar2 == (Fl_Type *)0x0) break;
    } while (p->level < pFVar2->level);
    iVar3 = p->level + 1;
  }
  for (pFVar4 = this->next; pFVar4 != (Fl_Type *)0x0; pFVar4 = pFVar4->next) {
    pFVar4->level = pFVar4->level + (iVar3 - this->level);
  }
  this->level = iVar3;
  if (pFVar2 == (Fl_Type *)0x0) {
    if (first == (Fl_Type *)0x0) {
      first = this;
      last = pFVar1;
      pFVar1->next = (Fl_Type *)0x0;
      this->prev = (Fl_Type *)0x0;
    }
    else {
      this->prev = last;
      last->next = this;
      pFVar1->next = (Fl_Type *)0x0;
      last = pFVar1;
    }
  }
  else {
    pFVar4 = pFVar2->prev;
    this->prev = pFVar4;
    pFVar4->next = this;
    pFVar2->prev = pFVar1;
    pFVar1->next = pFVar2;
  }
  if (p != (Fl_Type *)0x0) {
    (*p->_vptr_Fl_Type[8])(p,this,0);
  }
  this->open_ = '\x01';
  fixvisible(this);
  set_modflag(1);
  Fl_Widget::redraw((Fl_Widget *)widget_browser);
  return;
}

Assistant:

void Fl_Type::add(Fl_Type *p) {
  if (p && parent == p) return;
  undo_checkpoint();
  parent = p;
  Fl_Type *end = this;
  while (end->next) end = end->next;
  Fl_Type *q;
  int newlevel;
  if (p) {
    for (q = p->next; q && q->level > p->level; q = q->next) {/*empty*/}
    newlevel = p->level+1;
  } else {
    q = 0;
    newlevel = 0;
  }
  for (Fl_Type *t = this->next; t; t = t->next) t->level += (newlevel-level);
  level = newlevel;
  if (q) {
    prev = q->prev;
    prev->next = this;
    q->prev = end;
    end->next = q;
  } else if (first) {
    prev = last;
    prev->next = this;
    end->next = 0;
    last = end;
  } else {
    first = this;
    last = end;
    prev = end->next = 0;
  }
  if (p) p->add_child(this,0);
  open_ = 1;
  fixvisible(this);
  set_modflag(1);
  widget_browser->redraw();
}